

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O2

void __thiscall CCharacterCore::Move(CCharacterCore *this)

{
  CWorldCore *pCVar1;
  CCharacterCore *pCVar2;
  vec2 vVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar11;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar13;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar14;
  float fVar15;
  float fVar16;
  vec2 NewPos;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->m_pWorld;
  if (pCVar1 != (CWorldCore *)0x0) {
    fVar8 = (this->m_Vel).field_0.x;
    fVar7 = (this->m_Vel).field_1.y;
    fVar9 = SQRT(fVar8 * fVar8 + fVar7 * fVar7) * 50.0;
    fVar10 = (float)(pCVar1->m_Tuning).m_VelrampStart.m_Value / 100.0;
    fVar7 = 1.0;
    if (fVar10 <= fVar9) {
      fVar7 = powf((float)(pCVar1->m_Tuning).m_VelrampCurvature.m_Value / 100.0,
                   (fVar9 - fVar10) / ((float)(pCVar1->m_Tuning).m_VelrampRange.m_Value / 100.0));
      fVar7 = 1.0 / fVar7;
      fVar8 = (this->m_Vel).field_0.x;
    }
    (this->m_Vel).field_0.x = fVar8 * fVar7;
    _local_20 = this->m_Pos;
    CCollision::MoveBox(this->m_pCollision,(vec2 *)&local_20,&this->m_Vel,(vec2)0x41e0000041e00000,
                        0.0,&this->m_Death);
    (this->m_Vel).field_0.x = (1.0 / fVar7) * (this->m_Vel).field_0.x;
    fVar8 = (float)(this->m_pWorld->m_Tuning).m_PlayerCollision.m_Value / 100.0;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      fVar8 = (this->m_Pos).field_0.x - local_20.x;
      fVar7 = (this->m_Pos).field_1.y - aStack_1c.y;
      fVar8 = SQRT(fVar8 * fVar8 + fVar7 * fVar7);
      iVar4 = (int)(fVar8 + 1.0);
      vVar3 = this->m_Pos;
      iVar5 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      aVar11 = vVar3.field_0;
      aVar12 = vVar3.field_1;
      for (; iVar5 != iVar4; iVar5 = iVar5 + 1) {
        fVar7 = (float)iVar5 / fVar8;
        aVar13.x = fVar7 * (local_20.x - aVar11.x) + aVar11.x;
        aVar14.y = fVar7 * (aStack_1c.y - aVar12.y) + aVar12.y;
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
          pCVar2 = this->m_pWorld->m_apCharacters[lVar6];
          if (pCVar2 != this && pCVar2 != (CCharacterCore *)0x0) {
            fVar9 = (pCVar2->m_Pos).field_0.x;
            fVar10 = (pCVar2->m_Pos).field_1.y;
            fVar15 = aVar13.x - fVar9;
            fVar16 = aVar14.y - fVar10;
            fVar15 = SQRT(fVar15 * fVar15 + fVar16 * fVar16);
            if ((fVar15 < 28.0) && (0.0 <= fVar15)) {
              if (fVar7 <= 0.0) {
                fVar9 = local_20.x - fVar9;
                fVar10 = aStack_1c.y - fVar10;
                if (fVar15 < SQRT(fVar9 * fVar9 + fVar10 * fVar10)) {
                  this->m_Pos = _local_20;
                }
              }
              else {
                this->m_Pos = vVar3;
              }
              goto LAB_00140580;
            }
          }
        }
        vVar3.field_1.y = aVar14.y;
        vVar3.field_0.x = aVar13.x;
      }
    }
    this->m_Pos = _local_20;
  }
LAB_00140580:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacterCore::Move()
{
	if(!m_pWorld)
		return;

	float RampValue = VelocityRamp(length(m_Vel)*50, m_pWorld->m_Tuning.m_VelrampStart, m_pWorld->m_Tuning.m_VelrampRange, m_pWorld->m_Tuning.m_VelrampCurvature);

	m_Vel.x = m_Vel.x*RampValue;

	vec2 NewPos = m_Pos;
	m_pCollision->MoveBox(&NewPos, &m_Vel, vec2(PHYS_SIZE, PHYS_SIZE), 0, &m_Death);

	m_Vel.x = m_Vel.x*(1.0f/RampValue);

	if(m_pWorld->m_Tuning.m_PlayerCollision)
	{
		// check player collision
		float Distance = distance(m_Pos, NewPos);
		int End = Distance+1;
		vec2 LastPos = m_Pos;
		for(int i = 0; i < End; i++)
		{
			float a = i/Distance;
			vec2 Pos = mix(m_Pos, NewPos, a);
			for(int p = 0; p < MAX_CLIENTS; p++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[p];
				if(!pCharCore || pCharCore == this)
					continue;
				float D = distance(Pos, pCharCore->m_Pos);
				if(D < PHYS_SIZE && D >= 0.0f)
				{
					if(a > 0.0f)
						m_Pos = LastPos;
					else if(distance(NewPos, pCharCore->m_Pos) > D)
						m_Pos = NewPos;
					return;
				}
			}
			LastPos = Pos;
		}
	}

	m_Pos = NewPos;
}